

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

void Gia_WinCreateFromCut(Gia_Man_t *p,Vec_Int_t *vIn,Vec_Wec_t *vLevels,Vec_Int_t *vWin)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  Vec_Int_t *vUsed;
  int Level;
  int iObj;
  int f;
  int i;
  int k;
  Gia_Obj_t *pFanout;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLevel;
  Vec_Int_t *vWin_local;
  Vec_Wec_t *vLevels_local;
  Vec_Int_t *vIn_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = Vec_WecSizeSize(vLevels);
  if (iVar1 == 0) {
    Vec_IntClear(vWin);
    Gia_ManIncrementTravId(p);
    for (iObj = 0; iVar1 = Vec_IntSize(vIn), iObj < iVar1; iObj = iObj + 1) {
      iVar1 = Vec_IntEntry(vIn,iObj);
      Gia_ObjSetTravIdCurrentId(p,iVar1);
      iVar2 = Gia_ObjLevelId(p,iVar1);
      Vec_WecPush(vLevels,iVar2,iVar1);
      Vec_IntPush(vWin,iVar1);
      iVar1 = Gia_ObjLevelId(p,iVar1);
      Vec_IntPushUniqueOrder(p_00,iVar1);
    }
    for (f = 0; iVar1 = Vec_IntSize(p_00), f < iVar1; f = f + 1) {
      iVar1 = Vec_IntEntry(p_00,f);
      p_01 = Vec_WecEntry(vLevels,iVar1);
      iObj = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p_01);
        bVar4 = false;
        if (iObj < iVar1) {
          iVar1 = Vec_IntEntry(p_01,iObj);
          pFanout = Gia_ManObj(p,iVar1);
          bVar4 = pFanout != (Gia_Obj_t *)0x0;
        }
        if (!bVar4) break;
        for (Level = 0;
            (iVar1 = Gia_ObjFanoutNum(p,pFanout), Level < iVar1 &&
            (pObj_00 = Gia_ObjFanout(p,pFanout,Level), Level != 5)); Level = Level + 1) {
          iVar1 = Gia_ObjIsAnd(pObj_00);
          if ((iVar1 != 0) && (iVar1 = Gia_ObjIsTravIdCurrent(p,pObj_00), iVar1 == 0)) {
            pGVar3 = Gia_ObjFanin0(pObj_00);
            iVar1 = Gia_ObjIsTravIdCurrent(p,pGVar3);
            if (iVar1 != 0) {
              pGVar3 = Gia_ObjFanin1(pObj_00);
              iVar1 = Gia_ObjIsTravIdCurrent(p,pGVar3);
              if (iVar1 != 0) {
                Gia_ObjSetTravIdCurrent(p,pObj_00);
                iVar1 = Gia_ObjLevel(p,pObj_00);
                iVar2 = Gia_ObjId(p,pObj_00);
                Vec_WecPush(vLevels,iVar1,iVar2);
                iVar1 = Gia_ObjId(p,pObj_00);
                Vec_IntPush(vWin,iVar1);
                iVar1 = Gia_ObjLevel(p,pObj_00);
                Vec_IntPushUniqueOrder(p_00,iVar1);
              }
            }
          }
        }
        iObj = iObj + 1;
      }
      Vec_IntClear(p_01);
    }
    Vec_IntSort(vWin,0);
    Vec_IntFree(p_00);
    return;
  }
  __assert_fail("Vec_WecSizeSize(vLevels) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                ,0x3de,
                "void Gia_WinCreateFromCut(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)");
}

Assistant:

void Gia_WinCreateFromCut( Gia_Man_t * p, Vec_Int_t * vIn, Vec_Wec_t * vLevels, Vec_Int_t * vWin )
{
    Vec_Int_t * vLevel; 
    Gia_Obj_t * pObj, * pFanout;
    int k, i, f, iObj, Level;
    Vec_Int_t * vUsed = Vec_IntAlloc( 100 );
    // precondition:  the levelized structure is empty
    assert( Vec_WecSizeSize(vLevels) == 0 );
    // clean the resulting array
    Vec_IntClear( vWin );
    // start a new trav ID and add nodes to the levelized structure
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vIn, iObj, i )
    {
        Gia_ObjSetTravIdCurrentId( p, iObj );
        Vec_WecPush( vLevels, Gia_ObjLevelId(p, iObj), iObj );
        Vec_IntPush( vWin, iObj );
        Vec_IntPushUniqueOrder( vUsed, Gia_ObjLevelId(p, iObj) );
    }
    // iterate through all objects and explore their fanouts
    //Vec_WecForEachLevel( vLevels, vLevel, k )
    Vec_IntForEachEntry( vUsed, Level, k )
    {
        vLevel = Vec_WecEntry( vLevels, Level );
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            Gia_ObjForEachFanoutStatic( p, pObj, pFanout, f )
            {
                if ( f == 5 ) // explore first 5 fanouts of the node
                    break;
                if ( Gia_ObjIsAnd(pFanout) && // internal node
                    !Gia_ObjIsTravIdCurrent(p, pFanout) && // not in the window
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pFanout)) && // but fanins are
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pFanout)) )  // in the window
                {
                    // add fanout to the window and to the levelized structure
                    Gia_ObjSetTravIdCurrent( p, pFanout );
                    Vec_WecPush( vLevels, Gia_ObjLevel(p, pFanout), Gia_ObjId(p, pFanout) );
                    Vec_IntPush( vWin, Gia_ObjId(p, pFanout) );
                    Vec_IntPushUniqueOrder( vUsed, Gia_ObjLevel(p, pFanout) );
                }
            }
        Vec_IntClear( vLevel );
    }
    Vec_IntSort( vWin, 0 );
    Vec_IntFree( vUsed );
}